

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::forestPackColumns(CLUFactor<double> *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  Dring *pDVar11;
  long lVar12;
  
  pCVar1 = &(this->u).col;
  piVar4 = (this->u).col.idx;
  pdVar5 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->u).col.len;
  piVar7 = (this->u).col.max;
  piVar8 = (this->u).col.start;
  uVar9 = 0;
  pDVar11 = &pCVar1->list;
  while (pDVar11 = ((Dring *)&pDVar11->next)->next, (Col *)pDVar11 != pCVar1) {
    iVar2 = pDVar11->idx;
    if (piVar8[iVar2] != (int)uVar9) goto LAB_001a8b28;
    iVar3 = piVar6[iVar2];
    uVar9 = (ulong)(uint)((int)uVar9 + iVar3);
    piVar7[iVar2] = iVar3;
  }
LAB_001a8b69:
  (this->u).col.used = (int)uVar9;
  piVar7[this->thedim] = 0;
  return;
LAB_001a8b28:
  do {
    iVar2 = pDVar11->idx;
    lVar10 = (long)piVar8[iVar2];
    piVar8[iVar2] = (int)uVar9;
    iVar3 = piVar6[iVar2];
    piVar7[iVar2] = iVar3;
    lVar12 = iVar3 + lVar10;
    uVar9 = (ulong)(int)uVar9;
    for (; lVar10 < lVar12; lVar10 = lVar10 + 1) {
      pdVar5[uVar9] = pdVar5[lVar10];
      piVar4[uVar9] = piVar4[lVar10];
      uVar9 = uVar9 + 1;
    }
    pDVar11 = pDVar11->next;
  } while ((Col *)pDVar11 != pCVar1);
  goto LAB_001a8b69;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}